

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IFileStream *pStream)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Char *pCVar5;
  IDataBlob **ppDataBlob;
  IDataBlob *pIVar6;
  char (*in_RCX) [10];
  undefined1 local_80 [8];
  string msg_1;
  RefCntAutoPtr<Diligent::IDataBlob> local_50;
  RefCntAutoPtr<Diligent::IDataBlob> pDataBlob;
  undefined1 local_38 [8];
  string msg;
  IFileStream *pStream_local;
  DeviceObjectArchive *this_local;
  
  msg.field_2._8_8_ = pStream;
  if (pStream == (IFileStream *)0x0) {
    FormatString<char[29]>((string *)local_38,(char (*) [29])"File stream must not be null");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [10])0x29d;
    DebugAssertionFailed
              (pCVar5,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x29d);
    std::__cxx11::string::~string((string *)local_38);
  }
  RefCntAutoPtr<Diligent::IDataBlob>::RefCntAutoPtr(&local_50);
  RefCntAutoPtr<Diligent::IDataBlob>::operator&
            ((RefCntAutoPtr<Diligent::IDataBlob> *)((long)&msg_1.field_2 + 8));
  ppDataBlob = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IDataBlob__
                         ((DoublePtrHelper *)(msg_1.field_2._M_local_buf + 8));
  Serialize(this,ppDataBlob);
  RefCntAutoPtr<Diligent::IDataBlob>::DoublePtrHelper<Diligent::IDataBlob>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IDataBlob> *)((long)&msg_1.field_2 + 8));
  bVar2 = RefCntAutoPtr<Diligent::IDataBlob>::operator!(&local_50);
  if (bVar2) {
    FormatString<char[26],char[10]>
              ((string *)local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pDataBlob",in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x2a0);
    std::__cxx11::string::~string((string *)local_80);
  }
  uVar1 = msg.field_2._8_8_;
  pIVar6 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&local_50);
  iVar3 = (*(pIVar6->super_IObject)._vptr_IObject[7])(pIVar6,0);
  pIVar6 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&local_50);
  iVar4 = (*(pIVar6->super_IObject)._vptr_IObject[5])();
  (**(code **)(*(long *)uVar1 + 0x30))(uVar1,iVar3,iVar4);
  RefCntAutoPtr<Diligent::IDataBlob>::~RefCntAutoPtr(&local_50);
  return;
}

Assistant:

void DeviceObjectArchive::Serialize(IFileStream* pStream) const
{
    DEV_CHECK_ERR(pStream != nullptr, "File stream must not be null");
    RefCntAutoPtr<IDataBlob> pDataBlob;
    Serialize(&pDataBlob);
    VERIFY_EXPR(pDataBlob);
    pStream->Write(pDataBlob->GetConstDataPtr(), pDataBlob->GetSize());
}